

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDFace * __thiscall ON_SubDEdgePtr::RelativeFace(ON_SubDEdgePtr *this,int relative_face_index)

{
  ulong uVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFace *pOVar3;
  ON_SubDFace *pOVar4;
  ulong uVar5;
  ulong uVar6;
  ON_SubDFace *pOVar7;
  ulong uVar8;
  ON_SubDFace *pOVar9;
  ON_SubDFace *LR [2];
  
  if ((uint)relative_face_index < 2) {
    uVar5 = this->m_ptr & 0xfffffffffffffff8;
    if ((uVar5 != 0) && (uVar6 = (ulong)*(ushort *)(uVar5 + 100), uVar6 < 3)) {
      LR[0] = (ON_SubDFace *)0x0;
      if (uVar6 != 0) {
        uVar8 = 0;
        LR[0] = (ON_SubDFace *)0x0;
        pOVar7 = (ON_SubDFace *)0x0;
        do {
          uVar1 = *(ulong *)(uVar5 + 0x68 + uVar8 * 8);
          pOVar9 = (ON_SubDFace *)(uVar1 & 0xfffffffffffffff8);
          if (pOVar9 != (ON_SubDFace *)0x0) {
            pOVar3 = pOVar9;
            pOVar4 = pOVar7;
            pOVar2 = LR[0];
            if ((uVar1 & 1) == 0) {
              pOVar3 = LR[0];
              pOVar4 = pOVar9;
              pOVar2 = pOVar7;
            }
            pOVar7 = pOVar4;
            LR[0] = pOVar3;
            if (pOVar2 != (ON_SubDFace *)0x0) {
              return (ON_SubDFace *)0x0;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      uVar5 = (ulong)(1 - relative_face_index);
      if ((this->m_ptr & 1) == 0) {
        uVar5 = (ulong)(uint)relative_face_index;
      }
      return LR[uVar5 - 1];
    }
  }
  return (ON_SubDFace *)0x0;
}

Assistant:

const class ON_SubDFace* ON_SubDEdgePtr::RelativeFace(
  int relative_face_index
) const
{
  if (relative_face_index < 0 || relative_face_index > 1)
    return nullptr; // invalid input
  
  const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
  if (nullptr == e )
    return nullptr; // null input

  if (nullptr == e || e->m_face_count > 2)
    return nullptr; // nonmanifold edge

  const ON_SubDFace* LR[2] = {};
  for (unsigned short efi = 0; efi < e->m_face_count; ++efi)
  {
    const ON__UINT_PTR ptr = e->m_face2[efi].m_ptr;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(ptr);
    if (nullptr == f)
      continue;
    if (0 == ON_SUBD_FACE_DIRECTION(ptr))
    {
      if (nullptr != LR[0])
        return nullptr; // not an oriented manifold interior edge
      LR[0] = f;
    }
    else
    {
      if (nullptr != LR[1])
        return nullptr; // not an oriented manifold interior edge
      LR[1] = f;
    }
  }

  if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
    relative_face_index = 1 - relative_face_index;
  return LR[relative_face_index];
}